

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v11::vprint(ostream *os,string_view fmt,format_args args)

{
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_220.super_buffer<char>.capacity_ = 500;
  detail::vformat_to(&local_220.super_buffer<char>,fmt,args,(locale_ref)0x0);
  detail::write_buffer<char>(os,&local_220.super_buffer<char>);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&local_220);
  return;
}

Assistant:

inline void vprint(std::ostream& os, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  FILE* f = nullptr;
#if FMT_MSVC_STL_UPDATE && FMT_USE_RTTI
  if (auto* buf = dynamic_cast<std::filebuf*>(os.rdbuf()))
    f = detail::get_file(*buf);
#elif defined(_WIN32) && defined(__GLIBCXX__) && FMT_USE_RTTI
  auto* rdbuf = os.rdbuf();
  if (auto* sfbuf = dynamic_cast<__gnu_cxx::stdio_sync_filebuf<char>*>(rdbuf))
    f = sfbuf->file();
  else if (auto* fbuf = dynamic_cast<__gnu_cxx::stdio_filebuf<char>*>(rdbuf))
    f = fbuf->file();
#endif
#ifdef _WIN32
  if (f) {
    int fd = _fileno(f);
    if (_isatty(fd)) {
      os.flush();
      if (detail::write_console(fd, {buffer.data(), buffer.size()})) return;
    }
  }
#endif
  detail::ignore_unused(f);
  detail::write_buffer(os, buffer);
}